

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_FormatDateTime
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  anon_class_24_3_b29ebb90 executor;
  CallInfo CVar2;
  undefined1 end [4];
  char16 *pcVar3;
  IRecyclerVisitedObject IVar4;
  Type TVar5;
  DynamicObject *pDVar6;
  bool bVar7;
  UBool UVar8;
  int iVar9;
  CallFlags e;
  BOOL BVar10;
  charcount_t cVar11;
  charcount_t cVar12;
  int iVar13;
  undefined4 uVar14;
  ScriptContext *pSVar15;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar16;
  Var pvVar17;
  JavascriptBoolean *pJVar18;
  undefined8 uVar19;
  void **ppvVar20;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Recycler *pRVar21;
  UFieldPositionIterator *pUVar22;
  LPCSTR pCVar23;
  JavascriptString *pJVar24;
  anon_class_16_2_20bc470f executor_00;
  uint in_stack_fffffffffffffc60;
  ulong uVar25;
  JavascriptString *pJStack_208;
  UDateFormatField fieldKind;
  JavascriptString *typeString;
  int local_1f8;
  int kind;
  int i;
  int lastPartEnd;
  int partEnd;
  int partStart;
  JavascriptArray *ret;
  JavascriptLibrary *library;
  undefined1 *puStack_1d0;
  ScopedUFieldPositionIterator *local_1c8;
  ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70> local_1b0;
  ScopedUFieldPositionIterator fpi;
  undefined1 local_194 [4];
  undefined1 auStack_190 [4];
  int formattedLen;
  char16 *formatted;
  double actualGregorianChange;
  double beginningOfTime;
  char *calType;
  UCalendar *cal;
  char localeID [157];
  JavascriptString *pattern;
  anon_union_8_3_7fb8a913_for_next local_b0;
  JavascriptString *timeZone;
  JavascriptString *local_a0;
  JavascriptString *langtag;
  undefined1 auStack_90 [4];
  UErrorCode status;
  FinalizableUDateFormat *dtf;
  Var cachedUDateFormat;
  Type TStack_78;
  bool forDatePrototypeToLocaleString;
  double date;
  Type TStack_68;
  bool toParts;
  DynamicObject *state;
  ScriptContext *scriptContext;
  Type TStack_50;
  uint argCount;
  undefined1 local_48 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  pSVar15 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar15);
  pSVar15 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar15,(PVOID)0x0);
  iVar9 = _count_args(callInfo);
  values = _get_va(&stack0x00000000,iVar9);
  args.Values = (Type)callInfo;
  bVar7 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x9e9,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  TStack_50.ptr = (RuntimeFunction *)callInfo;
  Arguments::Arguments((Arguments *)local_48,callInfo,values);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar7 = operator!(e);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x9e9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar7) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  scriptContext._4_4_ = local_48._0_4_ & 0xffffff;
  state = (DynamicObject *)RecyclableObject::GetScriptContext(function);
  if (scriptContext._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x9e9,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar7) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  if ((local_48._0_4_ & 0xffffff) == 5) {
    pvVar17 = Arguments::operator[]((Arguments *)local_48,1);
    bVar7 = DynamicObject::IsBaseDynamicObject(pvVar17);
    if (bVar7) {
      pvVar17 = Arguments::operator[]((Arguments *)local_48,2);
      bVar7 = TaggedInt::Is(pvVar17);
      if (!bVar7) {
        pvVar17 = Arguments::operator[]((Arguments *)local_48,2);
        bVar7 = JavascriptNumber::Is(pvVar17);
        if (!bVar7) goto LAB_0109ba29;
      }
      pvVar17 = Arguments::operator[]((Arguments *)local_48,3);
      bVar7 = VarIs<Js::JavascriptBoolean>(pvVar17);
      if (bVar7) {
        pvVar17 = Arguments::operator[]((Arguments *)local_48,4);
        bVar7 = VarIs<Js::JavascriptBoolean>(pvVar17);
        if (bVar7) goto LAB_0109ba94;
      }
    }
  }
LAB_0109ba29:
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar16 = 1;
  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                              ,0xa2b,
                              "((args.Info.Count == 5 && DynamicObject::IsBaseDynamicObject(args[1]) && (TaggedInt::Is(args[2]) || JavascriptNumber::Is(args[2])) && VarIs<JavascriptBoolean>(args[3]) && VarIs<JavascriptBoolean>(args[4])))"
                              ,"Intl platform function given bad arguments");
  if (!bVar7) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar16 = 0;
LAB_0109ba94:
  pvVar17 = Arguments::operator[]((Arguments *)local_48,1);
  TStack_68.ptr = (RuntimeFunction *)UnsafeVarTo<Js::DynamicObject>(pvVar17);
  pvVar17 = Arguments::operator[]((Arguments *)local_48,3);
  pJVar18 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar17);
  BVar10 = JavascriptBoolean::GetValue(pJVar18);
  date._7_1_ = BVar10 != 0;
  pvVar17 = Arguments::operator[]((Arguments *)local_48,2);
  TStack_78.ptr = (RuntimeFunction *)JavascriptDate::TimeClip(pvVar17);
  BVar10 = JavascriptNumber::IsNan((double)TStack_78.ptr);
  if (BVar10 != 0) {
    JavascriptError::ThrowRangeError((ScriptContext *)state,-0x7ff5ebfc,(PCWSTR)0x0);
  }
  pvVar17 = Arguments::operator[]((Arguments *)local_48,4);
  pJVar18 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar17);
  BVar10 = JavascriptBoolean::GetValue(pJVar18);
  cachedUDateFormat._7_1_ = BVar10 != 0;
  uVar14 = SUB84(TStack_78.ptr,0);
  if ((bool)cachedUDateFormat._7_1_) {
    Output::Trace(IntlPhase,L"%S(): Calling new Date(%f).toLocaleString(...)\n",uVar14,
                  "EntryIntl_FormatDateTime");
  }
  else if ((date._7_1_ & 1) == 0) {
    Output::Trace(IntlPhase,L"%S(): Calling DateTimeFormat.prototype.format(new Date(%f))\n",uVar14,
                  "EntryIntl_FormatDateTime");
  }
  else {
    Output::Trace(IntlPhase,L"%S(): Calling DateTimeFormat.prototype.formatToParts(new Date(%f))\n",
                  uVar14,"EntryIntl_FormatDateTime");
  }
  dtf = (FinalizableUDateFormat *)0x0;
  _auStack_90 = (_func_int **)0x0;
  langtag._4_4_ = U_ZERO_ERROR;
  iVar9 = (*((TStack_68.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                    (TStack_68.ptr,TStack_68.ptr,0xb,&dtf,0,state);
  TVar5.ptr = TStack_68.ptr;
  if (iVar9 == 0) {
    PropertyIds::PropertyIds((PropertyIds *)((long)&timeZone + 4),locale);
    local_a0 = AssertStringProperty((DynamicObject *)TVar5.ptr,timeZone._4_4_);
    TVar5.ptr = TStack_68.ptr;
    PropertyIds::PropertyIds((PropertyIds *)((long)&pattern + 4),timeZone);
    local_b0.base =
         (DListNodeBase<Memory::ArenaData_*> *)
         AssertStringProperty((DynamicObject *)TVar5.ptr,pattern._4_4_);
    TVar5.ptr = TStack_68.ptr;
    PropertyIds::PropertyIds((PropertyIds *)(localeID + 0x9c),pattern);
    pJVar24 = AssertStringProperty((DynamicObject *)TVar5.ptr,(PropertyIds)stack0xffffffffffffff3c);
    memset(&cal,0,0x9d);
    LangtagToLocaleID<157ul>(local_a0,(char (*) [157])&cal);
    pRVar21 = ScriptContext::GetRecycler((ScriptContext *)state);
    uVar19 = (*(code *)((local_b0.base)->next).base[0x32].prev)();
    cVar11 = JavascriptString::GetLength((JavascriptString *)local_b0.base);
    iVar9 = (*(pJVar24->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])();
    cVar12 = JavascriptString::GetLength(pJVar24);
    uVar25 = (long)&langtag + 4;
    ppvVar20 = (void **)udat_open_70(0xfffffffe,0xfffffffe,&cal,uVar19,cVar11,iVar9,cVar12);
    _auStack_90 = (_func_int **)FinalizableICUObject<void_**,_&udat_close_70>::New(pRVar21,ppvVar20)
    ;
    if (langtag._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar8 = U_FAILURE(langtag._4_4_);
    if ((UVar8 != '\0') || (langtag._4_4_ == U_STRING_NOT_TERMINATED_WARNING)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      pCVar23 = (LPCSTR)u_errorName_70(langtag._4_4_);
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xa66,"(false)",pCVar23);
      if (!bVar7) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    ppvVar20 = FinalizableICUObject::operator_cast_to_void__((FinalizableICUObject *)_auStack_90);
    calType = (char *)udat_getCalendar_70(ppvVar20);
    beginningOfTime = (double)ucal_getType_70(calType,(long)&langtag + 4);
    if (langtag._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar8 = U_FAILURE(langtag._4_4_);
    if ((UVar8 == '\0') && (langtag._4_4_ != U_STRING_NOT_TERMINATED_WARNING)) {
      if (beginningOfTime == 0.0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0xa6d,"(calType != nullptr)","calType != nullptr");
        if (!bVar7) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      pCVar23 = (LPCSTR)u_errorName_70(langtag._4_4_);
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xa6d,"(false)",pCVar23);
      if (!bVar7) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    iVar9 = strcmp((char *)beginningOfTime,"gregorian");
    if (iVar9 == 0) {
      actualGregorianChange = -8.64e+15;
      ucal_setGregorianChange_70(0xc2dc0000,calType,(long)&langtag + 4);
      formatted = (char16 *)ucal_getGregorianChange_70(calType,(long)&langtag + 4);
      if (langtag._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
        Throw::OutOfMemory();
      }
      UVar8 = U_FAILURE(langtag._4_4_);
      if ((UVar8 == '\0') && (langtag._4_4_ != U_STRING_NOT_TERMINATED_WARNING)) {
        if (((actualGregorianChange != (double)formatted) ||
            (NAN(actualGregorianChange) || NAN((double)formatted))) &&
           ((actualGregorianChange != (double)formatted ||
            (NAN(actualGregorianChange) || NAN((double)formatted))))) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0xa73,"(beginningOfTime == actualGregorianChange)",
                                      "beginningOfTime == actualGregorianChange");
          if (!bVar7) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        pCVar23 = (LPCSTR)u_errorName_70(langtag._4_4_);
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0xa73,"(false)",pCVar23);
        if (!bVar7) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
    }
    IVar4._vptr_IRecyclerVisitedObject = _auStack_90;
    iVar9 = (*(local_a0->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
    iVar13 = (*(pJVar24->super_RecyclableObject).super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
    uVar14 = (*(code *)((local_b0.base)->next).base[0x32].prev)();
    Output::Trace(IntlPhase,
                  L"%S(): Caching new UDateFormat (0x%x) with langtag=%s, pattern=%s, timezone=%s\n"
                  ,"EntryIntl_FormatDateTime",IVar4._vptr_IRecyclerVisitedObject,
                  CONCAT44(extraout_var,iVar9),CONCAT44(extraout_var_00,iVar13),uVar14);
    (*((TStack_68.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x19])
              (TStack_68.ptr,0xb,_auStack_90,0,0);
  }
  else {
    _auStack_90 = (_func_int **)dtf;
    Output::Trace(IntlPhase,L"%S(): Using previously cached UDateFormat (0x%x)\n",
                  "EntryIntl_FormatDateTime",dtf);
    uVar25 = (ulong)in_stack_fffffffffffffc60;
  }
  _auStack_190 = (char16 *)0x0;
  local_194 = (undefined1  [4])0x0;
  if ((date._7_1_ & 1) == 0) {
    fpi.object = (UFieldPositionIterator *)auStack_90;
    pRVar21 = ScriptContext::GetRecycler((ScriptContext *)state);
    executor_00.date = (double *)pRVar21;
    executor_00.dtf = (FinalizableUDateFormat **)&stack0xffffffffffffff88;
    EnsureBuffer<Js::IntlEngineInterfaceExtensionObject::EntryIntl_FormatDateTime(Js::RecyclableObject*,Js::CallInfo,___)::__0>
              ((Js *)fpi.object,executor_00,(Recycler *)auStack_190,(char16 **)local_194,
               (int *)&DAT_00000001,true,(int)uVar25);
    callInfo_local =
         (CallInfo)
         JavascriptString::NewWithBuffer(_auStack_190,(charcount_t)local_194,(ScriptContext *)state)
    ;
  }
  else {
    pUVar22 = (UFieldPositionIterator *)ufieldpositer_open_70((long)&langtag + 4);
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70>
    ::ScopedICUObject(&local_1b0,pUVar22);
    if (langtag._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar8 = U_FAILURE(langtag._4_4_);
    if ((UVar8 != '\0') || (langtag._4_4_ == U_STRING_NOT_TERMINATED_WARNING)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      pCVar23 = (LPCSTR)u_errorName_70(langtag._4_4_);
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xa92,"(false)",pCVar23);
      if (!bVar7) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    library = (JavascriptLibrary *)auStack_90;
    puStack_1d0 = (undefined1 *)&stack0xffffffffffffff88;
    local_1c8 = &local_1b0;
    pRVar21 = ScriptContext::GetRecycler((ScriptContext *)state);
    executor.date._0_4_ = (int)puStack_1d0;
    executor.dtf = (FinalizableUDateFormat **)library;
    executor.date._4_4_ = (int)((ulong)puStack_1d0 >> 0x20);
    executor.fpi = local_1c8;
    EnsureBuffer<Js::IntlEngineInterfaceExtensionObject::EntryIntl_FormatDateTime(Js::RecyclableObject*,Js::CallInfo,___)::__1>
              (executor,pRVar21,(char16 **)auStack_190,(int *)local_194,true,8);
    ret = (JavascriptArray *)ScriptContext::GetLibrary((ScriptContext *)state);
    _partEnd = (CallInfo)JavascriptLibrary::CreateArray((JavascriptLibrary *)ret,0);
    lastPartEnd = 0;
    i = 0;
    kind = 0;
    local_1f8 = 0;
    pUVar22 = PlatformAgnostic::ICUHelpers::ScopedICUObject::
              operator_cast_to_UFieldPositionIterator_((ScopedICUObject *)&local_1b0);
    typeString._4_4_ = ufieldpositer_next_70(pUVar22,&lastPartEnd,&i);
    while (-1 < typeString._4_4_) {
      if ((i <= lastPartEnd) || ((int)local_194 < i)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0xaa5,"(partStart < partEnd && partEnd <= formattedLen)",
                                    "partStart < partEnd && partEnd <= formattedLen");
        if (!bVar7) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      switch(typeString._4_4_) {
      case 0:
        pJStack_208 = JavascriptLibrary::GetIntlEraPartString((JavascriptLibrary *)ret);
        break;
      case 1:
      case 0x14:
      case 0x1e:
        pJStack_208 = JavascriptLibrary::GetIntlYearPartString((JavascriptLibrary *)ret);
        break;
      case 2:
      case 0x1a:
        pJStack_208 = JavascriptLibrary::GetIntlMonthPartString((JavascriptLibrary *)ret);
        break;
      case 3:
        pJStack_208 = JavascriptLibrary::GetIntlDayPartString((JavascriptLibrary *)ret);
        break;
      case 4:
      case 5:
      case 0xf:
      case 0x10:
        pJStack_208 = JavascriptLibrary::GetIntlHourPartString((JavascriptLibrary *)ret);
        break;
      case 6:
        pJStack_208 = JavascriptLibrary::GetIntlMinutePartString((JavascriptLibrary *)ret);
        break;
      case 7:
        pJStack_208 = JavascriptLibrary::GetIntlSecondPartString((JavascriptLibrary *)ret);
        break;
      default:
        pJStack_208 = JavascriptLibrary::GetIntlUnknownPartString((JavascriptLibrary *)ret);
        break;
      case 9:
      case 0x13:
      case 0x19:
        pJStack_208 = JavascriptLibrary::GetIntlWeekdayPartString((JavascriptLibrary *)ret);
        break;
      case 0xe:
        pJStack_208 = JavascriptLibrary::GetIntlDayPeriodPartString((JavascriptLibrary *)ret);
        break;
      case 0x11:
      case 0x17:
      case 0x18:
      case 0x1d:
      case 0x1f:
      case 0x20:
      case 0x21:
        pJStack_208 = JavascriptLibrary::GetIntlTimeZoneNamePartString((JavascriptLibrary *)ret);
      }
      pDVar6 = state;
      pcVar3 = _auStack_190;
      CVar2 = _partEnd;
      iVar9 = lastPartEnd;
      if (kind < lastPartEnd) {
        pJVar24 = JavascriptLibrary::GetIntlLiteralPartString((JavascriptLibrary *)ret);
        AddPartToPartsArray((ScriptContext *)pDVar6,(JavascriptArray *)CVar2,local_1f8,pcVar3,kind,
                            iVar9,pJVar24);
        local_1f8 = local_1f8 + 1;
      }
      AddPartToPartsArray((ScriptContext *)state,(JavascriptArray *)_partEnd,local_1f8,_auStack_190,
                          lastPartEnd,i,pJStack_208);
      kind = i;
      pUVar22 = PlatformAgnostic::ICUHelpers::ScopedICUObject::
                operator_cast_to_UFieldPositionIterator_((ScopedICUObject *)&local_1b0);
      typeString._4_4_ = ufieldpositer_next_70(pUVar22,&lastPartEnd,&i);
      local_1f8 = local_1f8 + 1;
    }
    if ((undefined1  [4])kind != local_194) {
      if ((int)local_194 <= kind) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0xae6,"(lastPartEnd < formattedLen)",
                                    "lastPartEnd < formattedLen");
        if (!bVar7) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      pDVar6 = state;
      pcVar3 = _auStack_190;
      end = local_194;
      CVar2 = _partEnd;
      pJVar24 = JavascriptLibrary::GetIntlLiteralPartString((JavascriptLibrary *)ret);
      AddPartToPartsArray((ScriptContext *)pDVar6,(JavascriptArray *)CVar2,local_1f8,pcVar3,kind,
                          (int)end,pJVar24);
    }
    callInfo_local = _partEnd;
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UFieldPositionIterator_*,_&ufieldpositer_close_70>
    ::~ScopedICUObject(&local_1b0);
  }
  return (Var)callInfo_local;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_FormatDateTime(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#ifdef INTL_WINGLOB
        if (args.Info.Count < 3 || !(TaggedInt::Is(args.Values[1]) || JavascriptNumber::Is(args.Values[1])) || !DynamicObject::IsBaseDynamicObject(args.Values[2]))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        Windows::Foundation::DateTime winDate;
        HRESULT hr;
        if (TaggedInt::Is(args.Values[1]))
        {
            hr = Js::DateUtilities::ES5DateToWinRTDate(TaggedInt::ToInt32(args.Values[1]), &(winDate.UniversalTime));
        }
        else
        {
            hr = Js::DateUtilities::ES5DateToWinRTDate(JavascriptNumber::GetValue(args.Values[1]), &(winDate.UniversalTime));
        }
        if (FAILED(hr))
        {
            HandleOOMSOEHR(hr);
            // If conversion failed, double value is outside the range of WinRT DateTime
            Js::JavascriptError::ThrowRangeError(scriptContext, JSERR_OutOfDateTimeRange);
        }

        DynamicObject* obj = VarTo<DynamicObject>(args.Values[2]);
        Var hiddenObject = nullptr;
        AssertOrFailFastMsg(obj->GetInternalProperty(obj, Js::InternalPropertyIds::HiddenObject, &hiddenObject, NULL, scriptContext),
            "EntryIntl_FormatDateTime: Could not retrieve hiddenObject.");

        //We are going to perform the same check for timeZone as when caching the formatter.
        Var propertyValue = nullptr;
        AutoHSTRING result;

        //If timeZone is undefined; then use the standard dateTimeFormatter to format in local time; otherwise use the IDateTimeFormatter2 to format using specified timezone (UTC)
        if (!GetPropertyBuiltInFrom(obj, __timeZone) || JavascriptOperators::IsUndefinedObject(propertyValue))
        {
            DateTimeFormatting::IDateTimeFormatter *formatter = static_cast<DateTimeFormatting::IDateTimeFormatter *>(((AutoCOMJSObject *)hiddenObject)->GetInstance());
            Assert(formatter);
            IfFailThrowHr(formatter->Format(winDate, &result));
        }
        else
        {
            DateTimeFormatting::IDateTimeFormatter2 *formatter = static_cast<DateTimeFormatting::IDateTimeFormatter2 *>(((AutoCOMJSObject *)hiddenObject)->GetInstance());
            Assert(formatter);
            HSTRING timeZone;
            HSTRING_HEADER timeZoneHeader;

            // IsValidTimeZone() has already verified that this is JavascriptString.
            JavascriptString* userDefinedTimeZoneId = VarTo<JavascriptString>(propertyValue);
            IfFailThrowHr(WindowsCreateStringReference(userDefinedTimeZoneId->GetSz(), userDefinedTimeZoneId->GetLength(), &timeZoneHeader, &timeZone));
            Assert(timeZone);

            IfFailThrowHr(formatter->FormatUsingTimeZone(winDate, timeZone, &result));
        }
        PCWSTR strBuf = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary()->WindowsGetStringRawBuffer(*result, NULL);

        return Js::JavascriptString::NewCopySz(strBuf, scriptContext);
#else
        // This function vaguely implements ECMA 402 #sec-partitiondatetimepattern
        INTL_CHECK_ARGS(
            args.Info.Count == 5 &&
            DynamicObject::IsBaseDynamicObject(args[1]) &&
            (TaggedInt::Is(args[2]) || JavascriptNumber::Is(args[2])) &&
            VarIs<JavascriptBoolean>(args[3]) &&
            VarIs<JavascriptBoolean>(args[4])
        );

        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[1]);
        bool toParts = Js::UnsafeVarTo<Js::JavascriptBoolean>(args[3])->GetValue();

        // 1. Let x be TimeClip(x)
        // 2. If x is NaN, throw a RangeError exception
        double date = JavascriptDate::TimeClip(args[2]);
        if (JavascriptNumber::IsNan(date))
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidDate);
        }

        bool forDatePrototypeToLocaleString = UnsafeVarTo<JavascriptBoolean>(args[4])->GetValue();
        if (forDatePrototypeToLocaleString)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Date_Prototype_toLocaleString);
            INTL_TRACE("Calling new Date(%f).toLocaleString(...)", date);
        }
        else if (toParts)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(DateTimeFormat_Prototype_formatToParts);
            INTL_TRACE("Calling DateTimeFormat.prototype.formatToParts(new Date(%f))", date);
        }
        else
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(DateTimeFormat_Prototype_format);
            INTL_TRACE("Calling DateTimeFormat.prototype.format(new Date(%f))", date);
        }

        // Below, we lazy-initialize the backing UDateFormat on the first call to format{ToParts}
        // On subsequent calls, the UDateFormat will be cached in state.CachedUDateFormat
        Var cachedUDateFormat = nullptr;
        FinalizableUDateFormat *dtf = nullptr;
        UErrorCode status = U_ZERO_ERROR;
        if (state->GetInternalProperty(state, InternalPropertyIds::CachedUDateFormat, &cachedUDateFormat, nullptr, scriptContext))
        {
            dtf = reinterpret_cast<FinalizableUDateFormat *>(cachedUDateFormat);
            INTL_TRACE("Using previously cached UDateFormat (0x%x)", dtf);
        }
        else
        {
            JavascriptString *langtag = AssertStringProperty(state, PropertyIds::locale);
            JavascriptString *timeZone = AssertStringProperty(state, PropertyIds::timeZone);
            JavascriptString *pattern = AssertStringProperty(state, PropertyIds::pattern);

            char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
            LangtagToLocaleID(langtag, localeID);

            dtf = FinalizableUDateFormat::New(scriptContext->GetRecycler(), udat_open(
                UDAT_PATTERN,
                UDAT_PATTERN,
                localeID,
                reinterpret_cast<const UChar *>(timeZone->GetSz()),
                timeZone->GetLength(),
                reinterpret_cast<const UChar *>(pattern->GetSz()),
                pattern->GetLength(),
                &status
            ));
            ICU_ASSERT(status, true);

            // DateTimeFormat is expected to use the "proleptic Gregorian calendar", which means that the Julian calendar should never be used.
            // To accomplish this, we can set the switchover date between julian/gregorian
            // to the ECMAScript beginning of time, which is -8.64e15 according to ecma262 #sec-time-values-and-time-range
            UCalendar *cal = const_cast<UCalendar *>(udat_getCalendar(*dtf));
            const char *calType = ucal_getType(cal, &status);
            ICU_ASSERT(status, calType != nullptr);
            if (strcmp(calType, "gregorian") == 0)
            {
                double beginningOfTime = -8.64e15;
                ucal_setGregorianChange(cal, beginningOfTime, &status);
                double actualGregorianChange = ucal_getGregorianChange(cal, &status);
                ICU_ASSERT(status, beginningOfTime == actualGregorianChange);
            }

            INTL_TRACE("Caching new UDateFormat (0x%x) with langtag=%s, pattern=%s, timezone=%s", dtf, langtag->GetSz(), pattern->GetSz(), timeZone->GetSz());

            // cache dtf for later use (so that the condition that brought us here returns true for future calls)
            state->SetInternalProperty(
                InternalPropertyIds::CachedUDateFormat,
                dtf,
                PropertyOperationFlags::PropertyOperation_None,
                nullptr
            );
        }

        // We intentionally special-case the following two calls to EnsureBuffer to allow zero-length strings.
        // See comment in GetPatternForSkeleton.

        char16 *formatted = nullptr;
        int formattedLen = 0;
        if (!toParts)
        {
            // if we aren't formatting to parts, we simply want to call udat_format with retry
            EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
            {
                return udat_format(*dtf, date, buf, bufLen, nullptr, status);
            }, scriptContext->GetRecycler(), &formatted, &formattedLen, /* allowZeroLengthStrings */ true);
            return JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext);
        }

        // The rest of this function most closely corresponds to ECMA 402 #sec-partitiondatetimepattern
        ScopedUFieldPositionIterator fpi(ufieldpositer_open(&status));
        ICU_ASSERT(status, true);
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return udat_formatForFields(*dtf, date, buf, bufLen, fpi, status);
        }, scriptContext->GetRecycler(), &formatted, &formattedLen, /* allowZeroLengthStrings */ true);

        JavascriptLibrary *library = scriptContext->GetLibrary();
        JavascriptArray* ret = library->CreateArray(0);

        int partStart = 0;
        int partEnd = 0;
        int lastPartEnd = 0;
        int i = 0;
        for (
            int kind = ufieldpositer_next(fpi, &partStart, &partEnd);
            kind >= 0;
            kind = ufieldpositer_next(fpi, &partStart, &partEnd), ++i
        )
        {
            Assert(partStart < partEnd && partEnd <= formattedLen);
            JavascriptString *typeString = nullptr;
            UDateFormatField fieldKind = (UDateFormatField)kind;
            switch (fieldKind)
            {
            case UDAT_ERA_FIELD:
                typeString = library->GetIntlEraPartString(); break;
            case UDAT_YEAR_FIELD:
            case UDAT_EXTENDED_YEAR_FIELD:
            case UDAT_YEAR_NAME_FIELD:
                typeString = library->GetIntlYearPartString(); break;
            case UDAT_MONTH_FIELD:
            case UDAT_STANDALONE_MONTH_FIELD:
                typeString = library->GetIntlMonthPartString(); break;
            case UDAT_DATE_FIELD:
                typeString = library->GetIntlDayPartString(); break;
            case UDAT_HOUR_OF_DAY1_FIELD:
            case UDAT_HOUR_OF_DAY0_FIELD:
            case UDAT_HOUR1_FIELD:
            case UDAT_HOUR0_FIELD:
                typeString = library->GetIntlHourPartString(); break;
            case UDAT_MINUTE_FIELD:
                typeString = library->GetIntlMinutePartString(); break;
            case UDAT_SECOND_FIELD:
                typeString = library->GetIntlSecondPartString(); break;
            case UDAT_DAY_OF_WEEK_FIELD:
            case UDAT_STANDALONE_DAY_FIELD:
            case UDAT_DOW_LOCAL_FIELD:
                typeString = library->GetIntlWeekdayPartString(); break;
            case UDAT_AM_PM_FIELD:
                typeString = library->GetIntlDayPeriodPartString(); break;
            case UDAT_TIMEZONE_FIELD:
            case UDAT_TIMEZONE_RFC_FIELD:
            case UDAT_TIMEZONE_GENERIC_FIELD:
            case UDAT_TIMEZONE_SPECIAL_FIELD:
            case UDAT_TIMEZONE_LOCALIZED_GMT_OFFSET_FIELD:
            case UDAT_TIMEZONE_ISO_FIELD:
            case UDAT_TIMEZONE_ISO_LOCAL_FIELD:
                typeString = library->GetIntlTimeZoneNamePartString(); break;
#if defined(ICU_VERSION) && ICU_VERSION == 55
            case UDAT_TIME_SEPARATOR_FIELD:
                // ICU 55 (Ubuntu 16.04 system default) has the ":" in "5:23 PM" as a special field
                // Intl should just treat this as a literal
                typeString = library->GetIntlLiteralPartString(); break;
#endif
            default:
                typeString = library->GetIntlUnknownPartString(); break;
            }

            if (partStart > lastPartEnd)
            {
                // formatForFields does not report literal fields directly, so we have to detect them
                // by seeing if the current part starts after the previous one ended
                AddPartToPartsArray(scriptContext, ret, i, formatted, lastPartEnd, partStart, library->GetIntlLiteralPartString());
                i += 1;
            }

            AddPartToPartsArray(scriptContext, ret, i, formatted, partStart, partEnd, typeString);
            lastPartEnd = partEnd;
        }

        // Sometimes, there can be a literal at the end of the string, such as when formatting just the year in
        // the chinese calendar, where the pattern string will be `r(U)`. The trailing `)` will be a literal
        if (lastPartEnd != formattedLen)
        {
            AssertOrFailFast(lastPartEnd < formattedLen);

            // `i` was incremented by the consequence of the last iteration of the for loop
            AddPartToPartsArray(scriptContext, ret, i, formatted, lastPartEnd, formattedLen, library->GetIntlLiteralPartString());
        }

        return ret;
#endif
    }